

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::CloneFrom
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  int w;
  uint value;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  long lVar7;
  uint index;
  size_t sVar6;
  
  pCVar1 = (this->rep).full.root;
  if ((CharSetNode *)&DAT_00000005 < pCVar1) {
    (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
  }
  (this->rep).compact.countPlusOne = 1;
  (this->rep).compact.cs[0] = 0xffffffff;
  (this->rep).compact.cs[1] = 0xffffffff;
  (this->rep).compact.cs[2] = 0xffffffff;
  (this->rep).compact.cs[3] = 0xffffffff;
  pCVar1 = (other->rep).full.root;
  if ((undefined1 *)((long)&pCVar1[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    (this->rep).full.root = (CharSetNode *)((ulong)((int)pCVar1 - 1) + 1);
    index = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      sVar6 = (other->rep).compact.countPlusOne;
      if (4 < sVar6 - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        sVar6 = (other->rep).compact.countPlusOne;
      }
      if ((int)sVar6 - 1U <= index) break;
      value = GetCompactCharU(other,index);
      ReplaceCompactCharU(this,index,value);
      index = index + 1;
    }
  }
  else {
    if (pCVar1 == (CharSetNode *)0x0) {
      sVar6 = 0;
    }
    else {
      iVar4 = (*pCVar1->_vptr_CharSetNode[1])(pCVar1,allocator);
      sVar6 = CONCAT44(extraout_var,iVar4);
    }
    (this->rep).compact.countPlusOne = sVar6;
    lVar7 = 0;
    do {
      *(undefined4 *)((long)&this->rep + lVar7 * 4 + 8) =
           *(undefined4 *)((long)&other->rep + lVar7 * 4 + 8);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
  }
  return;
}

Assistant:

void CharSet<char16>::CloneFrom(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        Clear(allocator);
        Assert(IsCompact());
        if (other.IsCompact())
        {
            this->SetCompactLength(other.GetCompactLength());
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                this->ReplaceCompactCharU(i, other.GetCompactCharU(i));
            }
        }
        else
        {
            rep.full.root = other.rep.full.root == nullptr ? nullptr : other.rep.full.root->Clone(allocator);
            rep.full.direct.CloneFrom(other.rep.full.direct);
        }
    }